

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O3

Point * __thiscall p2t::Triangle::PointCCW(Triangle *this,Point *point)

{
  if (this->points_[0] == point) {
    return this->points_[1];
  }
  if (this->points_[1] != point) {
    if (this->points_[2] == point) {
      return this->points_[0];
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/poly2tri/poly2tri/common/shapes.cc"
                  ,0xec,"Point *p2t::Triangle::PointCCW(const Point &)");
  }
  return this->points_[2];
}

Assistant:

Point* Triangle::PointCCW(const Point& point)
{
  if (&point == points_[0]) {
    return points_[1];
  } else if (&point == points_[1]) {
    return points_[2];
  } else if (&point == points_[2]) {
    return points_[0];
  }
  assert(0);
  return NULL;
}